

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_test_class.cpp
# Opt level: O1

void test_test::test_wchar_t_compare_invoker(void)

{
  char *pcVar1;
  size_type sVar2;
  char local_1e0 [32];
  undefined1 local_1c0 [376];
  char *local_48;
  size_type local_40;
  char local_38;
  undefined7 uStack_37;
  
  memset((ostringstream *)local_1c0,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
  local_40 = 0;
  local_38 = '\0';
  local_1e0[0] = '\"';
  local_48 = &local_38;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,local_1e0,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c0,"test_wchar_t_compare",0x14);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"\" fixture ctor",0xe);
  std::__cxx11::stringbuf::str();
  test_wchar_t_compare_invoker();
  sVar2 = local_40;
  pcVar1 = local_48;
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,pcVar1,sVar2);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x3c;
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
  std::ios_base::~ios_base((ios_base *)(local_1c0 + 0x70));
  memset((ostringstream *)local_1c0,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
  local_40 = 0;
  local_38 = '\0';
  local_1e0[0] = '\"';
  local_48 = &local_38;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,local_1e0,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c0,"test_wchar_t_compare",0x14);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"\" fixture setup",0xf);
  std::__cxx11::stringbuf::str();
  test_wchar_t_compare_invoker();
  sVar2 = local_40;
  pcVar1 = local_48;
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,pcVar1,sVar2);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x3c;
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
  std::ios_base::~ios_base((ios_base *)(local_1c0 + 0x70));
  memset((ostringstream *)local_1c0,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
  local_40 = 0;
  local_38 = '\0';
  local_1e0[0] = '\"';
  local_48 = &local_38;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,local_1e0,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c0,"test_wchar_t_compare",0x14);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"\" test entry",0xc);
  std::__cxx11::stringbuf::str();
  test_wchar_t_compare_invoker();
  sVar2 = local_40;
  pcVar1 = local_48;
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,pcVar1,sVar2);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x3c;
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
  std::ios_base::~ios_base((ios_base *)(local_1c0 + 0x70));
  memset((ostringstream *)local_1c0,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
  local_40 = 0;
  local_38 = '\0';
  local_1e0[0] = '\"';
  local_48 = &local_38;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,local_1e0,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c0,"test_wchar_t_compare",0x14);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c0,"\" fixture teardown",0x12);
  std::__cxx11::stringbuf::str();
  test_wchar_t_compare_invoker();
  sVar2 = local_40;
  pcVar1 = local_48;
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,pcVar1,sVar2);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x3c;
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
  std::ios_base::~ios_base((ios_base *)(local_1c0 + 0x70));
  memset((ostringstream *)local_1c0,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
  local_40 = 0;
  local_38 = '\0';
  local_1e0[0] = '\"';
  local_48 = &local_38;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,local_1e0,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c0,"test_wchar_t_compare",0x14);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"\" fixture dtor",0xe);
  std::__cxx11::stringbuf::str();
  test_wchar_t_compare_invoker();
  sVar2 = local_40;
  pcVar1 = local_48;
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,pcVar1,sVar2);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x3c;
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
  std::ios_base::~ios_base((ios_base *)(local_1c0 + 0x70));
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_wchar_t_compare)
{
    wchar_t lwa1[] = L"World";
    wchar_t rwa1[] = L"World";
    const wchar_t lcwa2[] = L"World", rcwa2[] = L"World";
    const wchar_t *lcwp3 = L"World";
    const wchar_t *rcwp3 = L"World";
    const wchar_t * const lcwpc4 = L"World";
    const wchar_t * const rcwpc4 = L"World";

    // BOOST_CHECK_EQUAL(L"World", L"World");
    // BOOST_CHECK_EQUAL(L"World", rwa1);
    // BOOST_CHECK_EQUAL(L"World", rcwa2);
    // BOOST_CHECK_EQUAL(L"World", rcwp3);
    // BOOST_CHECK_EQUAL(L"World", rcwpc4);

    // BOOST_CHECK_EQUAL(lwa1, L"World");
    // BOOST_CHECK_EQUAL(lwa1, rwa1);
    // BOOST_CHECK_EQUAL(lwa1, rcwa2);
    // BOOST_CHECK_EQUAL(lwa1, rcwp3);
    // BOOST_CHECK_EQUAL(lwa1, rcwpc4);

    // BOOST_CHECK_EQUAL(lcwa2, L"World");
    // BOOST_CHECK_EQUAL(lcwa2, rwa1);
    // BOOST_CHECK_EQUAL(lcwa2, rcwa2);
    // BOOST_CHECK_EQUAL(lcwa2, rcwp3);
    // BOOST_CHECK_EQUAL(lcwa2, rcwpc4);

    // BOOST_CHECK_EQUAL(lcwp3, L"World");
    // BOOST_CHECK_EQUAL(lcwp3, rwa1);
    // BOOST_CHECK_EQUAL(lcwp3, rcwa2);
    // BOOST_CHECK_EQUAL(lcwp3, rcwp3);
    // BOOST_CHECK_EQUAL(lcwp3, rcwpc4);

    // BOOST_CHECK_EQUAL(lcwpc4, L"World");
    // BOOST_CHECK_EQUAL(lcwpc4, rwa1);
    // BOOST_CHECK_EQUAL(lcwpc4, rcwa2);
    // BOOST_CHECK_EQUAL(lcwpc4, rcwp3);
    // BOOST_CHECK_EQUAL(lcwpc4, rcwpc4);
}